

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O1

CURLcode Curl_auth_create_cram_md5_message(bufref *chlg,char *userp,char *passwdp,bufref *out)

{
  uint uVar1;
  CURLcode CVar2;
  size_t sVar3;
  HMAC_context *ctxt;
  size_t sVar4;
  uchar *ptr;
  char *__s;
  uchar digest [16];
  
  sVar3 = strlen(passwdp);
  uVar1 = curlx_uztoui(sVar3);
  ctxt = Curl_HMAC_init(&Curl_HMAC_MD5,(uchar *)passwdp,uVar1);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (ctxt != (HMAC_context *)0x0) {
    sVar4 = Curl_bufref_len(chlg);
    if (sVar4 != 0) {
      ptr = Curl_bufref_ptr(chlg);
      sVar4 = Curl_bufref_len(chlg);
      uVar1 = curlx_uztoui(sVar4);
      Curl_HMAC_update(ctxt,ptr,uVar1);
    }
    Curl_HMAC_final(ctxt,digest);
    __s = curl_maprintf("%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",userp,
                        (ulong)digest[0],(ulong)digest[1],(ulong)digest[2],(ulong)digest[3],
                        (ulong)digest[4],(ulong)digest[5],(ulong)digest[6],(ulong)digest[7],
                        (ulong)digest[8],(ulong)digest[9],(ulong)digest[10],(ulong)digest[0xb],
                        (ulong)digest[0xc],(ulong)digest[0xd],(ulong)digest[0xe],(ulong)digest[0xf])
    ;
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (__s != (char *)0x0) {
      sVar3 = strlen(__s);
      Curl_bufref_set(out,__s,sVar3,curl_free);
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_auth_create_cram_md5_message(const struct bufref *chlg,
                                           const char *userp,
                                           const char *passwdp,
                                           struct bufref *out)
{
  struct HMAC_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char *response;

  /* Compute the digest using the password as the key */
  ctxt = Curl_HMAC_init(&Curl_HMAC_MD5,
                        (const unsigned char *) passwdp,
                        curlx_uztoui(strlen(passwdp)));
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  if(Curl_bufref_len(chlg))
    Curl_HMAC_update(ctxt, Curl_bufref_ptr(chlg),
                     curlx_uztoui(Curl_bufref_len(chlg)));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, digest);

  /* Generate the response */
  response = aprintf(
    "%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
    userp, digest[0], digest[1], digest[2], digest[3], digest[4],
    digest[5], digest[6], digest[7], digest[8], digest[9], digest[10],
    digest[11], digest[12], digest[13], digest[14], digest[15]);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  Curl_bufref_set(out, response, strlen(response), curl_free);
  return CURLE_OK;
}